

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

_Bool is_number(char *name)

{
  ushort **ppuVar1;
  size_t sVar2;
  int local_1c;
  ecs_size_t s;
  ecs_size_t i;
  char *name_local;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[(int)*name] & 0x800) == 0) {
    name_local._7_1_ = false;
  }
  else {
    sVar2 = strlen(name);
    local_1c = 1;
    while ((local_1c < (int)sVar2 &&
           (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)name[local_1c]] & 0x800) != 0))) {
      local_1c = local_1c + 1;
    }
    name_local._7_1_ = (int)sVar2 <= local_1c;
  }
  return name_local._7_1_;
}

Assistant:

static
bool is_number(
    const char *name)
{
    if (!isdigit(name[0])) {
        return false;
    }

    ecs_size_t i, s = ecs_os_strlen(name);
    for (i = 1; i < s; i ++) {
        if (!isdigit(name[i])) {
            break;
        }
    }

    return i >= s;
}